

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O1

complex<double> __thiscall
VarianceSwapsHestonAnalyticalPricer::functionC
          (VarianceSwapsHestonAnalyticalPricer *this,double tau,double omega)

{
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar1;
  double dVar2;
  complex<double> cVar3;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  dVar2 = omega;
  HestonModel::getRiskFreeRate(this->hestonModel_);
  HestonModel::getDrift(this->hestonModel_);
  HestonModel::getMeanReversionSpeed(this->hestonModel_);
  HestonModel::getMeanReversionLevel(this->hestonModel_);
  HestonModel::getVolOfVol(this->hestonModel_);
  aTerm(this,omega);
  bTerm(this,omega);
  dVar1 = dVar2;
  gTerm(this,omega);
  dVar2 = -dVar2 * tau;
  local_28 = cexp(-(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) * tau);
  local_20 = dVar2;
  local_18 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  local_10 = dVar1;
  std::complex<double>::operator*=((complex<double> *)&local_18,(complex<double> *)&local_28);
  dVar2 = (double)__divdc3(SUB84(1.0 - local_18,0),-local_10,
                           1.0 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),-dVar1);
  clog(dVar2);
  cVar3._M_value._8_8_ = extraout_RDX;
  cVar3._M_value._0_8_ = extraout_RAX;
  return (complex<double>)cVar3._M_value;
}

Assistant:

std::complex<double> VarianceSwapsHestonAnalyticalPricer::
functionC(double tau, double omega) const {
    double r = hestonModel_->getRiskFreeRate(),
           mu = hestonModel_->getDrift(),
           kappa = hestonModel_->getMeanReversionSpeed(),
           theta = hestonModel_->getMeanReversionLevel(),
           sigma = hestonModel_->getVolOfVol();
    std::complex<double> a = aTerm(omega),
                        b = bTerm(omega),
                        g = gTerm(omega);
    return tau*(j * omega*mu - r)+ kappa * theta / (sigma*sigma) * ((a-b)*tau-2.*std::log((1.-g*std::exp(-b*tau))/(1.-g))) ; // definition in class
    // return tau * r * (j * omega - 1.)+ kappa * theta / (sigma*sigma) * ((a+b)*tau-2.*std::log((1.-g*std::exp(b*tau))/(1.-g))) ; // definition in PDF
}